

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O2

bool vk::isDebugReportSupported(PlatformInterface *vkp)

{
  bool bVar1;
  allocator<char> local_a1;
  _Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> local_a0;
  string local_88;
  Maybe<unsigned_int> local_68;
  Maybe<unsigned_int> local_58;
  RequiredExtension local_48;
  
  enumerateInstanceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &local_a0,vkp,(char *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"VK_EXT_debug_report",&local_a1);
  local_58.m_ptr = (uint *)0x0;
  local_68.m_ptr = (uint *)0x0;
  RequiredExtension::RequiredExtension(&local_48,&local_88,&local_58,&local_68);
  bVar1 = isExtensionSupported
                    ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                      *)&local_a0,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
  ~_Vector_base(&local_a0);
  return bVar1;
}

Assistant:

bool isDebugReportSupported (const PlatformInterface& vkp)
{
	return isExtensionSupported(enumerateInstanceExtensionProperties(vkp, DE_NULL),
								RequiredExtension("VK_EXT_debug_report"));
}